

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::printActiveChannels(EventLoop *this)

{
  bool bVar1;
  LogLevel LVar2;
  reference ppCVar3;
  LogStream *this_00;
  self *psVar4;
  SourceFile file;
  undefined1 local_1040 [48];
  SourceFile local_1010;
  Logger local_1000;
  Channel *local_30;
  Channel *channel;
  const_iterator __end2;
  const_iterator __begin2;
  ChannelList *__range2;
  EventLoop *this_local;
  
  __end2 = std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::begin
                     (&this->m_activeChannels);
  channel = (Channel *)
            std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::end
                      (&this->m_activeChannels);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<sznet::net::Channel_*const_*,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
                                *)&channel);
    if (!bVar1) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<sznet::net::Channel_*const_*,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
              ::operator*(&__end2);
    local_30 = *ppCVar3;
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 1) {
      Logger::SourceFile::SourceFile<100>
                (&local_1010,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file._12_4_ = 0;
      file.m_data = local_1010.m_data;
      file.m_size = local_1010.m_size;
      Logger::Logger(&local_1000,file,0x149,TRACE,"printActiveChannels");
      this_00 = Logger::stream(&local_1000);
      psVar4 = LogStream::operator<<(this_00,"{");
      Channel::reventsToString_abi_cxx11_((Channel *)local_1040);
      psVar4 = LogStream::operator<<(psVar4,(string *)local_1040);
      LogStream::operator<<(psVar4,"} ");
      std::__cxx11::string::~string((string *)local_1040);
      Logger::~Logger(&local_1000);
    }
    __gnu_cxx::
    __normal_iterator<sznet::net::Channel_*const_*,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void EventLoop::printActiveChannels() const
{
	for (const Channel* channel : m_activeChannels)
	{
		LOG_TRACE << "{" << channel->reventsToString() << "} ";
	}
}